

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
~Recycled(Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          *this)

{
  Stack<std::unique_ptr<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>_>
  *this_00;
  unique_ptr<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  *puVar1;
  _Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false> _Var2;
  
  _Var2._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
       .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (LiteralMatcher *)0x0) {
    if ((*(size_t *)((long)&(_Var2._M_head_impl)->super_Matcher + 0x20) != 0) &&
       (Recycled<Indexing::ClauseCodeTree::LiteralMatcher,Lib::NoReset,Lib::DefaultKeepRecycled>::
        memAlive == '\x01')) {
      this_00 = mem();
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
           .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl;
      (this->_self)._M_t.
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl =
           (LiteralMatcher *)0x0;
      puVar1 = this_00->_cursor;
      if (puVar1 == this_00->_end) {
        Stack<std::unique_ptr<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>_>
        ::expand(this_00);
        puVar1 = this_00->_cursor;
      }
      (puVar1->_M_t).
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl =
           _Var2._M_head_impl;
      this_00->_cursor = this_00->_cursor + 1;
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
           .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl;
      if (_Var2._M_head_impl == (LiteralMatcher *)0x0) goto LAB_002b8612;
    }
    std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>::operator()
              ((default_delete<Indexing::ClauseCodeTree::LiteralMatcher> *)this,_Var2._M_head_impl);
  }
LAB_002b8612:
  (this->_self)._M_t.
  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl =
       (LiteralMatcher *)0x0;
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }